

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O3

t_operand __thiscall
xemmai::ast::t_lambda::f_emit(t_lambda *this,t_emit *a_emit,bool a_tail,bool a_operand,bool a_clear)

{
  char *pcVar1;
  size_t sVar2;
  t_code *ptVar3;
  t_node *ptVar4;
  reference pvVar5;
  t_object *ptVar6;
  size_t sVar7;
  pointer puVar8;
  pointer puVar9;
  ulong uVar10;
  anon_union_8_4_0f1077ea_for_t_operand_2 extraout_RDX;
  anon_union_8_4_0f1077ea_for_t_operand_2 extraout_RDX_00;
  anon_union_8_4_0f1077ea_for_t_operand_2 aVar11;
  undefined7 in_register_00000081;
  t_object *ptVar12;
  ulong uVar13;
  t_operand tVar14;
  vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
  safe_positions1;
  deque<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_> labels1;
  t_object *local_178;
  undefined4 local_16c;
  vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
  local_168;
  t_code *local_150;
  t_object *local_148;
  vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
  *local_140;
  t_targets *local_138;
  deque<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_> *local_130;
  vector<bool,_std::allocator<bool>_> *local_128;
  size_t local_120;
  t_scope *local_118;
  t_code *ptStack_110;
  vector<bool,_std::allocator<bool>_> local_100;
  t_targets local_d8;
  _Deque_base<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_> local_88;
  
  local_16c = (undefined4)CONCAT71(in_register_00000081,a_clear);
  local_148 = f_code(this,a_emit->v_module);
  pcVar1 = local_148->v_data;
  local_118 = a_emit->v_scope;
  ptStack_110 = a_emit->v_code;
  a_emit->v_scope = &this->super_t_scope;
  a_emit->v_code = (t_code *)pcVar1;
  local_120 = a_emit->v_arguments;
  sVar2 = this->v_arguments;
  a_emit->v_arguments = sVar2;
  local_128 = a_emit->v_privates;
  local_88._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)((ulong)local_88._M_impl.super__Deque_impl_data._M_map & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_100,
             ((long)(this->super_t_scope).v_privates.
                    super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->super_t_scope).v_privates.
                    super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) - sVar2,(bool *)&local_88,
             (allocator_type *)&local_d8);
  a_emit->v_privates = &local_100;
  sVar2 = a_emit->v_stack;
  local_130 = a_emit->v_labels;
  a_emit->v_stack =
       (long)(this->super_t_scope).v_privates.
             super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->super_t_scope).v_privates.
             super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_>::
  _M_initialize_map(&local_88,0);
  a_emit->v_labels =
       (deque<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_> *)&local_88;
  local_138 = a_emit->v_targets;
  local_150 = (t_code *)pcVar1;
  pvVar5 = std::deque<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_>::
           emplace_back<>((deque<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_>
                           *)&local_88);
  local_d8.v_break = (t_label *)0x0;
  local_d8.v_break_junction = (t_block *)0x0;
  local_d8.v_break_stack = a_emit->v_stack;
  local_d8.v_break_is_tail = false;
  local_d8.v_break_must_clear = false;
  local_d8.v_continue = (t_label *)0x0;
  local_d8.v_continue_junction = (t_block *)0x0;
  local_d8.v_return_junction = &(this->super_t_scope).v_junction;
  local_d8.v_return_is_tail = true;
  a_emit->v_targets = &local_d8;
  local_140 = a_emit->v_safe_positions;
  local_168.
  super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.
  super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.
  super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  a_emit->v_safe_positions = &local_168;
  local_d8.v_return = pvVar5;
  local_d8.v_return_stack = local_d8.v_break_stack;
  if ((this->super_t_scope).v_self_shared == true) {
    local_178 = (t_object *)t_code::v_labels[0x1a];
    std::vector<void*,std::allocator<void*>>::emplace_back<void*>
              ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,&local_178);
    local_178 = (t_object *)a_emit->v_stack;
    std::vector<void*,std::allocator<void*>>::emplace_back<void*>
              ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,&local_178);
    local_178 = (t_object *)t_code::v_labels[0x16];
    std::vector<void*,std::allocator<void*>>::emplace_back<void*>
              ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,&local_178);
    local_178 = (t_object *)a_emit->v_stack;
    std::vector<void*,std::allocator<void*>>::emplace_back<void*>
              ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,&local_178);
    local_178 = (t_object *)0x0;
    std::vector<void*,std::allocator<void*>>::emplace_back<void*>
              ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,&local_178);
  }
  ptVar6 = (t_object *)this->v_arguments;
  if (ptVar6 != (t_object *)0x0) {
    ptVar12 = (t_object *)0x0;
    do {
      if ((this->super_t_scope).v_privates.
          super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
          ._M_impl.super__Vector_impl_data._M_start[(long)ptVar12]->v_shared == true) {
        local_178 = (t_object *)t_code::v_labels[0x10];
        std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                  ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,&local_178
                  );
        local_178 = (t_object *)a_emit->v_stack;
        std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                  ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,&local_178
                  );
        local_178 = ptVar12;
        std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                  ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,&local_178
                  );
        local_178 = (t_object *)t_code::v_labels[0x16];
        std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                  ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,&local_178
                  );
        local_178 = (t_object *)a_emit->v_stack;
        std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                  ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,&local_178
                  );
        local_178 = (t_object *)
                    (this->super_t_scope).v_privates.
                    super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[(long)ptVar12]->v_index;
        std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                  ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,&local_178
                  );
        ptVar6 = (t_object *)this->v_arguments;
      }
      ptVar12 = (t_object *)((long)&ptVar12->v_next + 1);
    } while (ptVar12 < ptVar6);
  }
  anon_unknown_11::f_emit_block
            ((anon_unknown_11 *)a_emit,
             (t_emit *)
             (this->super_t_scope).v_block.
             super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
              *)(this->super_t_scope).v_block.
                super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish,true,false,false);
  ptVar3 = a_emit->v_code;
  sVar7 = a_emit->v_stack - 1;
  a_emit->v_stack = sVar7;
  pvVar5->v_target =
       (long)(ptVar3->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(ptVar3->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  if (sVar7 != (long)(this->super_t_scope).v_privates.
                     super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->super_t_scope).v_privates.
                     super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) {
    __assert_fail("a_emit.v_stack == v_privates.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/shin1m[P]xemmai/src/ast.cc"
                  ,0xa9,
                  "virtual t_operand xemmai::ast::t_lambda::f_emit(t_emit &, bool, bool, bool)");
  }
  local_178 = (t_object *)t_code::v_labels[0x26];
  std::vector<void*,std::allocator<void*>>::emplace_back<void*>
            ((vector<void*,std::allocator<void*>> *)&ptVar3->v_instructions,&local_178);
  t_emit::f_resolve(a_emit);
  a_emit->v_scope = local_118;
  a_emit->v_code = ptStack_110;
  a_emit->v_arguments = local_120;
  a_emit->v_privates = local_128;
  a_emit->v_stack = sVar2;
  a_emit->v_labels = local_130;
  a_emit->v_targets = local_138;
  a_emit->v_safe_positions = local_140;
  if (a_emit->v_safe_points !=
      (map<std::pair<unsigned_long,_void_**>,_unsigned_long,_std::less<std::pair<unsigned_long,_void_**>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_void_**>,_unsigned_long>_>_>
       *)0x0) {
    f_safe_points(this,local_150,a_emit->v_safe_points,&local_168);
  }
  t_emit::f_emit_safe_point(a_emit,&this->super_t_node);
  if (this->v_variadic == true) {
    puVar8 = (this->v_defaults).
             super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar9 = (this->v_defaults).
             super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    puVar8 = (this->v_defaults).
             super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar9 = (this->v_defaults).
             super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar9 == puVar8) {
      local_178 = (t_object *)t_code::v_labels[0x18];
      std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,&local_178);
      goto LAB_00136b3e;
    }
  }
  if (puVar9 == puVar8) {
    uVar10 = 0;
  }
  else {
    uVar13 = 0;
    do {
      ptVar4 = puVar8[uVar13]._M_t.
               super___uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>
               ._M_t.
               super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>
               .super__Head_base<0UL,_xemmai::ast::t_node_*,_false>._M_head_impl;
      (*ptVar4->_vptr_t_node[3])(ptVar4,a_emit,0,0,0);
      uVar13 = uVar13 + 1;
      puVar8 = (this->v_defaults).
               super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar10 = (long)(this->v_defaults).
                     super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)puVar8 >> 3;
    } while (uVar13 < uVar10);
  }
  if (uVar10 != 0) {
    a_emit->v_stack = a_emit->v_stack - uVar10;
  }
  local_178 = (t_object *)t_code::v_labels[0x19];
  std::vector<void*,std::allocator<void*>>::emplace_back<void*>
            ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,&local_178);
LAB_00136b3e:
  local_178 = (t_object *)a_emit->v_stack;
  std::vector<void*,std::allocator<void*>>::emplace_back<void*>
            ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,&local_178);
  local_178 = local_148;
  std::vector<void*,std::allocator<void*>>::emplace_back<void*>
            ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,&local_178);
  sVar2 = a_emit->v_stack;
  uVar10 = sVar2 + 1;
  a_emit->v_stack = uVar10;
  if (a_emit->v_code->v_size < uVar10) {
    a_emit->v_code->v_size = uVar10;
  }
  if ((char)local_16c != '\0') {
    a_emit->v_stack = sVar2;
  }
  if (local_168.
      super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.
                    super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.
                          super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.
                          super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::deque<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_>::~deque
            ((deque<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_> *)&local_88);
  aVar11 = extraout_RDX;
  if (local_100.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_100.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_100.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_100.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    aVar11 = extraout_RDX_00;
  }
  tVar14.field_1.v_integer = aVar11.v_integer;
  tVar14._0_8_ = 4;
  return tVar14;
}

Assistant:

t_operand t_lambda::f_emit(t_emit& a_emit, bool a_tail, bool a_operand, bool a_clear)
{
	auto code = f_code(a_emit.v_module);
	auto& code1 = code->f_as<t_code>();
	auto scope0 = a_emit.v_scope;
	a_emit.v_scope = this;
	auto code0 = a_emit.v_code;
	a_emit.v_code = &code1;
	auto arguments0 = a_emit.v_arguments;
	a_emit.v_arguments = v_arguments;
	auto privates0 = a_emit.v_privates;
	std::vector<bool> privates1(v_privates.size() - v_arguments);
	a_emit.v_privates = &privates1;
	auto stack0 = a_emit.v_stack;
	a_emit.v_stack = v_privates.size();
	auto labels0 = a_emit.v_labels;
	std::deque<t_emit::t_label> labels1;
	a_emit.v_labels = &labels1;
	auto targets0 = a_emit.v_targets;
	auto& return0 = a_emit.f_label();
	t_emit::t_targets targets1{nullptr, nullptr, a_emit.v_stack, false, false, nullptr, nullptr, &return0, &v_junction, a_emit.v_stack, true};
	a_emit.v_targets = &targets1;
	auto safe_positions0 = a_emit.v_safe_positions;
	std::vector<std::tuple<size_t, size_t, size_t>> safe_positions1;
	a_emit.v_safe_positions = &safe_positions1;
	if (v_self_shared) a_emit
		<< c_instruction__SELF << a_emit.v_stack
		<< c_instruction__SCOPE_PUT0 << a_emit.v_stack << 0;
	for (size_t i = 0; i < v_arguments; ++i)
		if (v_privates[i]->v_shared) a_emit
			<< c_instruction__STACK_GET << a_emit.v_stack << i
			<< c_instruction__SCOPE_PUT0 << a_emit.v_stack << v_privates[i]->v_index;
	f_emit_block(a_emit, v_block, true, false);
	a_emit.f_pop();
	a_emit.f_target(return0);
	assert(a_emit.v_stack == v_privates.size());
	a_emit << c_instruction__RETURN_T;
	a_emit.f_resolve();
	a_emit.v_scope = scope0;
	a_emit.v_code = code0;
	a_emit.v_arguments = arguments0;
	a_emit.v_privates = privates0;
	a_emit.v_stack = stack0;
	a_emit.v_labels = labels0;
	a_emit.v_targets = targets0;
	a_emit.v_safe_positions = safe_positions0;
	if (a_emit.v_safe_points) f_safe_points(code1, *a_emit.v_safe_points, safe_positions1);
	a_emit.f_emit_safe_point(this);
	if (v_variadic || v_defaults.size() > 0) {
		for (size_t i = 0; i < v_defaults.size(); ++i) v_defaults[i]->f_emit(a_emit, false, false);
		for (size_t i = 0; i < v_defaults.size(); ++i) a_emit.f_pop();
		a_emit << c_instruction__ADVANCED_LAMBDA;
	} else {
		a_emit << c_instruction__LAMBDA;
	}
	(a_emit << a_emit.v_stack << code).f_push();
	if (a_clear) a_emit.f_pop();
	return {};
}